

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O3

RegexPattern * __thiscall
UnifiedRegex::RegexPattern::CopyToScriptContext(RegexPattern *this,ScriptContext *scriptContext)

{
  RegexPattern *pattern;
  Matcher *pMVar1;
  char *addr;
  
  pattern = New(scriptContext,(this->rep).unified.program.ptr,(bool)(this->field_0x18 & 1));
  pMVar1 = (this->rep).unified.matcher.ptr;
  if (pMVar1 == (Matcher *)0x0) {
    pMVar1 = (Matcher *)0x0;
  }
  else {
    pMVar1 = Matcher::CloneToScriptContext(pMVar1,scriptContext,pattern);
  }
  addr = (char *)((long)&pattern->rep + 8);
  Memory::Recycler::WBSetBit(addr);
  (pattern->rep).unified.matcher.ptr = pMVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pattern->field_0x18 = pattern->field_0x18 | 2;
  return pattern;
}

Assistant:

RegexPattern *RegexPattern::CopyToScriptContext(Js::ScriptContext *scriptContext)
    {
        // This routine assumes that this instance will outlive the copy, which is the case for copy-on-write,
        // and therefore doesn't copy the immutable parts of the pattern. This should not be confused with a
        // would be CloneToScriptContext which will would clone the immutable parts as well because the lifetime
        // of a clone might be longer than the original.

        RegexPattern *result = UnifiedRegex::RegexPattern::New(scriptContext, rep.unified.program, isLiteral);
        Matcher *matcherClone = rep.unified.matcher ? rep.unified.matcher->CloneToScriptContext(scriptContext, result) : nullptr;
        result->rep.unified.matcher = matcherClone;
        result->isShallowClone = true;
        return result;
    }